

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5AsciiTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                     _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined1 **p;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long in_FS_OFFSET;
  char aFold [64];
  int local_b0;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  if (nText < 1) {
    iVar11 = 0;
  }
  else {
    uVar2 = (ulong)(uint)nText;
    local_b0 = 0x40;
    p = &local_78;
    iVar11 = 0;
LAB_001f243e:
    uVar7 = (ulong)iVar11;
    uVar6 = (ulong)(iVar11 + 1U);
    if ((int)(iVar11 + 1U) < nText) {
      uVar6 = (ulong)(uint)nText;
    }
    do {
      uVar8 = uVar7;
      if (((long)pText[uVar7] < 0) || (pTokenizer[pText[uVar7]] != (Fts5Tokenizer)0x0)) break;
      uVar7 = uVar7 + 1;
      uVar8 = uVar6;
    } while ((long)uVar7 < (long)uVar2);
    iVar5 = (int)uVar8;
    if (iVar5 != nText) {
      uVar9 = iVar5 + 1;
      uVar6 = (ulong)uVar9;
      iVar11 = iVar5;
      if ((int)uVar9 < nText) {
        uVar7 = (long)(int)uVar9;
        do {
          uVar10 = uVar7;
          if ((-1 < (long)pText[uVar10]) &&
             (uVar6 = uVar10, iVar11 = (int)uVar8, pTokenizer[pText[uVar10]] == (Fts5Tokenizer)0x0))
          break;
          uVar6 = uVar2;
          uVar7 = uVar10 + 1;
          iVar11 = nText + -1;
          uVar8 = uVar10;
        } while (uVar2 != uVar10 + 1);
      }
      uVar9 = (int)uVar6 - iVar5;
      if (local_b0 < (int)uVar9) {
        if (p != &local_78) {
          sqlite3_free(p);
        }
        iVar4 = sqlite3_initialize();
        if ((iVar4 != 0) ||
           (p = (undefined1 **)sqlite3Malloc((ulong)uVar9 * 2), p == (undefined1 **)0x0)) {
          p = (undefined1 **)0x0;
          iVar5 = 7;
          goto LAB_001f2584;
        }
        local_b0 = uVar9 * 2;
      }
      if (0 < (int)uVar9) {
        uVar7 = 0;
        do {
          bVar1 = pText[uVar7 + (long)iVar5];
          bVar3 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar3 = bVar1;
          }
          *(byte *)((long)p + uVar7) = bVar3;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      iVar5 = (*xToken)(pCtx,0,(char *)p,uVar9,iVar5,(int)uVar6);
      iVar11 = iVar11 + 2;
      if ((nText <= iVar11) || (iVar5 != 0)) goto LAB_001f2571;
      goto LAB_001f243e;
    }
    iVar5 = 0;
LAB_001f2571:
    if (p != &local_78) {
LAB_001f2584:
      sqlite3_free(p);
    }
    iVar11 = 0;
    if (iVar5 != 0x65) {
      iVar11 = iVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

static int fts5AsciiTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  AsciiTokenizer *p = (AsciiTokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  int ie;
  int is = 0;

  char aFold[64];
  int nFold = sizeof(aFold);
  char *pFold = aFold;
  unsigned char *a = p->aTokenChar;

  UNUSED_PARAM(iUnused);

  while( is<nText && rc==SQLITE_OK ){
    int nByte;

    /* Skip any leading divider characters. */
    while( is<nText && ((pText[is]&0x80)==0 && a[(int)pText[is]]==0) ){
      is++;
    }
    if( is==nText ) break;

    /* Count the token characters */
    ie = is+1;
    while( ie<nText && ((pText[ie]&0x80) || a[(int)pText[ie]] ) ){
      ie++;
    }

    /* Fold to lower case */
    nByte = ie-is;
    if( nByte>nFold ){
      if( pFold!=aFold ) sqlite3_free(pFold);
      pFold = sqlite3_malloc64((sqlite3_int64)nByte*2);
      if( pFold==0 ){
        rc = SQLITE_NOMEM;
        break;
      }
      nFold = nByte*2;
    }
    asciiFold(pFold, &pText[is], nByte);

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, pFold, nByte, is, ie);
    is = ie+1;
  }

  if( pFold!=aFold ) sqlite3_free(pFold);
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}